

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void freestack(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *block;
  
  if ((L->stack).p != (StkId)0x0) {
    L->ci = &L->base_ci;
    block = (L->base_ci).next;
    (L->base_ci).next = (CallInfo *)0x0;
    while (block != (CallInfo *)0x0) {
      pCVar1 = block->next;
      luaM_free_(L,block,0x40);
      L->nci = L->nci - 1;
      block = pCVar1;
    }
    luaM_free_(L,(void *)(L->stack).offset,
               ((long)(L->stack_last).p - (long)(L->stack).offset) * 0x10000000 + 0x500000000 >>
               0x1c & 0xfffffffffffffff0);
    return;
  }
  return;
}

Assistant:

static void freestack (lua_State *L) {
  if (L->stack.p == NULL)
    return;  /* stack not completely built yet */
  L->ci = &L->base_ci;  /* free the entire 'ci' list */
  freeCI(L);
  lua_assert(L->nci == 0);
  luaM_freearray(L, L->stack.p, stacksize(L) + EXTRA_STACK);  /* free stack */
}